

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog.cpp
# Opt level: O0

void __thiscall
QPageSetupDialogPrivate::setPrinter(QPageSetupDialogPrivate *this,QPrinter *newPrinter)

{
  long lVar1;
  long lVar2;
  OutputFormat OVar3;
  long in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffa8;
  QPrinter *in_stack_ffffffffffffffb0;
  long *in_stack_ffffffffffffffb8;
  char local_28 [4];
  PrinterMode in_stack_ffffffffffffffdc;
  QPrinter *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2._0_4_ = in_RDI[0x17].context.version;
  lVar2._4_4_ = in_RDI[0x17].context.line;
  if (((lVar2 != 0) && (((ulong)in_RDI[0x17].context.file & 1) != 0)) &&
     (in_stack_ffffffffffffffb8 = *(long **)&in_RDI[0x17].context,
     in_stack_ffffffffffffffb8 != (long *)0x0)) {
    (**(code **)(*in_stack_ffffffffffffffb8 + 8))();
  }
  if (in_RSI == 0) {
    in_stack_ffffffffffffffb0 = (QPrinter *)operator_new(0x20);
    QPrinter::QPrinter(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    *(QPrinter **)&in_RDI[0x17].context = in_stack_ffffffffffffffb0;
    *(undefined1 *)&in_RDI[0x17].context.file = 1;
  }
  else {
    in_RDI[0x17].context.version = (int)in_RSI;
    in_RDI[0x17].context.line = (int)((ulong)in_RSI >> 0x20);
    *(undefined1 *)&in_RDI[0x17].context.file = 0;
  }
  OVar3 = QPrinter::outputFormat(in_stack_ffffffffffffffb0);
  if (OVar3 != NativeFormat) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)in_stack_ffffffffffffffb8,
               (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),in_stack_ffffffffffffffa8);
    QMessageLogger::warning(local_28,"QPageSetupDialog: Cannot be used on non-native printers");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPageSetupDialogPrivate::setPrinter(QPrinter *newPrinter)
{
    if (printer && ownsPrinter)
        delete printer;

    if (newPrinter) {
        printer = newPrinter;
        ownsPrinter = false;
    } else {
        printer = new QPrinter;
        ownsPrinter = true;
    }
    if (printer->outputFormat() != QPrinter::NativeFormat)
        qWarning("QPageSetupDialog: Cannot be used on non-native printers");
}